

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossy.c
# Opt level: O1

void test_even(void)

{
  long lVar1;
  uint64_t uVar2;
  undefined8 uVar3;
  int iVar4;
  quicly_cid_plaintext_t *pqVar5;
  bool bVar6;
  undefined8 uStackY_1a0;
  ptls_iovec_t pStackY_198;
  undefined8 uStack_180;
  undefined1 auStack_178 [8];
  uint8_t *local_170;
  size_t num_sent;
  undefined1 local_e4 [8];
  quicly_address_t srcaddr;
  undefined8 uStack_c0;
  undefined1 local_b0 [8];
  size_t num_received;
  undefined1 local_90 [8];
  iovec raw;
  size_t num_packets;
  loss_cond_t cond_down;
  loss_cond_t cond_up;
  
  uVar2 = quic_ctx.transport_params.max_udp_payload_size;
  quic_ctx.loss.time_reordering_percentile = 0x80;
  quic_ctx.loss.min_pto = 1;
  quic_ctx.loss.default_initial_rtt = 0x42;
  quic_ctx.loss.num_speculative_ptos = '\0';
  quic_ctx.loss._13_3_ = 0;
  num_packets = (size_t)cond_even_;
  cond_down.cb = (_func_int_loss_cond_t_ptr *)0x0;
  cond_down.data.even.cnt = (anon_struct_8_1_ba1d3cc9_for_even)0;
  cond_down.data.rand_.bits = 0;
  cond_down.data.rand_.bits_avail = (size_t)cond_even_;
  quic_now = 1;
  lVar1 = -(quic_ctx.transport_params.max_udp_payload_size + 0xf & 0xfffffffffffffff0);
  *(undefined8 *)(auStack_178 + lVar1 + -8) = 0x11cf87;
  pqVar5 = new_master_id();
  srcaddr._20_8_ = 0;
  uStack_c0 = 0;
  *(undefined8 *)((long)&pStackY_198 + lVar1) = 0;
  *(undefined8 *)((long)&pStackY_198 + lVar1 + 8) = 0;
  *(undefined8 *)(&stack0xfffffffffffffe78 + lVar1) = 0;
  *(undefined8 *)(auStack_178 + lVar1 + -8) = 0;
  *(undefined8 *)((long)&uStackY_1a0 + lVar1) = 0x11cfc1;
  iVar4 = quicly_connect(&client,&quic_ctx,"example.com",&fake_address.sa,(sockaddr *)0x0,pqVar5,
                         *(ptls_iovec_t *)((long)&pStackY_198 + lVar1),
                         *(ptls_handshake_properties_t **)(&stack0xfffffffffffffe78 + lVar1),
                         *(quicly_transport_parameters_t **)(auStack_178 + lVar1 + -8));
  *(undefined8 *)(auStack_178 + lVar1 + -8) = 0x11cfed;
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xb4)
  ;
  raw.iov_len = 1;
  *(uint64_t *)(&stack0xfffffffffffffe78 + lVar1) = uVar2;
  *(undefined8 *)((long)&pStackY_198 + lVar1 + 8) = 0x11d026;
  iVar4 = quicly_send(client,(quicly_address_t *)local_b0,(quicly_address_t *)local_e4,
                      (iovec *)local_90,&raw.iov_len,auStack_178 + lVar1,
                      *(size_t *)(&stack0xfffffffffffffe78 + lVar1));
  *(undefined8 *)(auStack_178 + lVar1 + -8) = 0x11d044;
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xb7)
  ;
  bVar6 = raw.iov_len == 1;
  *(undefined8 *)(auStack_178 + lVar1 + -8) = 0x11d065;
  _ok((uint)bVar6,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xb8)
  ;
  *(undefined8 *)(auStack_178 + lVar1 + -8) = 0x11d080;
  decode_packets((quicly_decoded_packet_t *)&stack0xfffffffffffffe90,(iovec *)local_90,1);
  bVar6 = raw.iov_len == 1;
  *(undefined8 *)(auStack_178 + lVar1 + -8) = 0x11d09c;
  _ok((uint)bVar6,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xba)
  ;
  *(undefined8 *)(auStack_178 + lVar1 + -8) = 0x11d0a1;
  pqVar5 = new_master_id();
  *(undefined8 *)(auStack_178 + lVar1 + -8) = 0;
  *(quicly_cid_plaintext_t **)(&stack0xfffffffffffffe78 + lVar1) = pqVar5;
  *(undefined8 *)((long)&pStackY_198 + lVar1 + 8) = 0x11d0c9;
  iVar4 = quicly_accept(&server,&quic_ctx,(sockaddr *)0x0,&fake_address.sa,
                        (quicly_decoded_packet_t *)&stack0xfffffffffffffe90,
                        (quicly_address_token_plaintext_t *)0x0,
                        *(quicly_cid_plaintext_t **)(&stack0xfffffffffffffe78 + lVar1),
                        *(ptls_handshake_properties_t **)(auStack_178 + lVar1 + -8));
  *(undefined8 *)(auStack_178 + lVar1 + -8) = 0x11d0e7;
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xbc)
  ;
  uVar3 = cond_down.data.rand_.bits_avail;
  *(undefined8 *)(auStack_178 + lVar1 + -8) = 0x11d0ed;
  (*(code *)uVar3)();
  pStackY_198.len = 0x11d11e;
  iVar4 = transmit_cond(server,client,(size_t *)&stack0xfffffffffffffe90,(size_t *)local_b0,
                        (loss_cond_t *)&num_packets,0,(ptls_buffer_t *)0x0);
  uStack_180 = 0x11d13c;
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xc2)
  ;
  uStack_180 = 0x11d159;
  _ok((uint)(local_170 == (uint8_t *)0x2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xc3)
  ;
  uStack_180 = 0x11d17c;
  _ok((uint)(local_b0 == (undefined1  [8])0x1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xc4)
  ;
  uStack_180 = 0x11d19f;
  _ok((uint)((client->super).state == QUICLY_STATE_CONNECTED),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xc5)
  ;
  uStack_180 = 0x11d1ab;
  iVar4 = quicly_connection_is_ready(client);
  uStack_180 = 0x11d1c5;
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xc6)
  ;
  quic_now = quic_now + 0x19;
  pStackY_198.len = 0x11d1f7;
  iVar4 = transmit_cond(client,server,(size_t *)&stack0xfffffffffffffe90,(size_t *)local_b0,
                        (loss_cond_t *)((long)&cond_down.data + 0x10),0,(ptls_buffer_t *)0x0);
  uStack_180 = 0x11d215;
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xcc)
  ;
  uStack_180 = 0x11d236;
  _ok((uint)(local_170 == (uint8_t *)0x1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xcd)
  ;
  uStack_180 = 0x11d25b;
  _ok((uint)(local_b0 == (undefined1  [8])0x0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xce)
  ;
  uStack_180 = 0x11d27e;
  _ok((uint)((client->super).state == QUICLY_STATE_CONNECTED),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xd0)
  ;
  uStack_180 = 0x11d28a;
  iVar4 = quicly_connection_is_ready(client);
  uStack_180 = 0x11d2a4;
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xd1)
  ;
  quic_now = quic_now + 1000;
  pStackY_198.len = 0x11d2d9;
  iVar4 = transmit_cond(server,client,(size_t *)&stack0xfffffffffffffe90,(size_t *)local_b0,
                        (loss_cond_t *)&num_packets,0,(ptls_buffer_t *)0x0);
  uStack_180 = 0x11d2f7;
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xd7)
  ;
  uStack_180 = 0x11d317;
  _ok((uint)(local_170 == (uint8_t *)0x2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xd8)
  ;
  uStack_180 = 0x11d33a;
  _ok((uint)(local_b0 == (undefined1  [8])0x1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xd9)
  ;
  uStack_180 = 0x11d35d;
  _ok((uint)((client->super).state == QUICLY_STATE_CONNECTED),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xda)
  ;
  uStack_180 = 0x11d369;
  iVar4 = quicly_connection_is_ready(client);
  uStack_180 = 0x11d383;
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xdb)
  ;
  quic_now = quic_now + 0x19;
  pStackY_198.len = 0x11d3b5;
  iVar4 = transmit_cond(client,server,(size_t *)&stack0xfffffffffffffe90,(size_t *)local_b0,
                        (loss_cond_t *)((long)&cond_down.data + 0x10),0,(ptls_buffer_t *)0x0);
  uStack_180 = 0x11d3d3;
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xe1)
  ;
  uStack_180 = 0x11d3f4;
  _ok((uint)(local_170 == (uint8_t *)0x1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xe2)
  ;
  uStack_180 = 0x11d410;
  _ok((uint)(local_b0 == (undefined1  [8])0x1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xe3)
  ;
  quic_now = quic_now + 1000;
  pStackY_198.len = 0x11d446;
  iVar4 = transmit_cond(server,client,(size_t *)&stack0xfffffffffffffe90,(size_t *)local_b0,
                        (loss_cond_t *)&num_packets,0,(ptls_buffer_t *)0x0);
  uStack_180 = 0x11d464;
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xe9)
  ;
  uStack_180 = 0x11d480;
  _ok((uint)(local_170 == (uint8_t *)0x1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xea)
  ;
  uStack_180 = 0x11d49c;
  _ok((uint)(local_b0 == (undefined1  [8])0x1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xeb)
  ;
  uStack_180 = 0x11d4bf;
  _ok((uint)((client->super).state == QUICLY_STATE_CONNECTED),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xed)
  ;
  uStack_180 = 0x11d4cb;
  iVar4 = quicly_connection_is_ready(client);
  uStack_180 = 0x11d4df;
  _ok(iVar4,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xee)
  ;
  pStackY_198.len = 0x11d506;
  iVar4 = transmit_cond(client,server,(size_t *)&stack0xfffffffffffffe90,(size_t *)local_b0,
                        (loss_cond_t *)((long)&cond_down.data + 0x10),0,(ptls_buffer_t *)0x0);
  uStack_180 = 0x11d524;
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xf2)
  ;
  uStack_180 = 0x11d545;
  _ok((uint)(local_170 == (uint8_t *)0x1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xf3)
  ;
  uStack_180 = 0x11d564;
  _ok((uint)(local_b0 == (undefined1  [8])0x0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xf4)
  ;
  quic_now = quic_now + 1000;
  pStackY_198.len = 0x11d5a3;
  iVar4 = transmit_cond(server,client,(size_t *)&stack0xfffffffffffffe90,(size_t *)local_b0,
                        (loss_cond_t *)&num_packets,0,(ptls_buffer_t *)0x0);
  uStack_180 = 0x11d5c1;
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xfa)
  ;
  uStack_180 = 0x11d5e2;
  _ok((uint)(local_170 == (uint8_t *)0x1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xfb)
  ;
  uStack_180 = 0x11d603;
  _ok((uint)(local_b0 == (undefined1  [8])0x0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xfc)
  ;
  quic_now = quic_now + 1000;
  pStackY_198.len = 0x11d638;
  iVar4 = transmit_cond(client,server,(size_t *)&stack0xfffffffffffffe90,(size_t *)local_b0,
                        (loss_cond_t *)((long)&cond_down.data + 0x10),0,(ptls_buffer_t *)0x0);
  uStack_180 = 0x11d656;
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0x102
     );
  uStack_180 = 0x11d67d;
  _ok((uint)(local_170 == (uint8_t *)0x1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0x103
     );
  uStack_180 = 0x11d698;
  _ok((uint)(local_b0 == (undefined1  [8])0x1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0x104
     );
  uStack_180 = 0x11d6bb;
  _ok((uint)((server->super).state == QUICLY_STATE_CONNECTED),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0x106
     );
  uStack_180 = 0x11d6c7;
  iVar4 = quicly_connection_is_ready(server);
  uStack_180 = 0x11d6db;
  _ok(iVar4,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0x107
     );
  quic_ctx.loss.time_reordering_percentile = 0x80;
  quic_ctx.loss.min_pto = 1;
  quic_ctx.loss.default_initial_rtt = 0x42;
  quic_ctx.loss.num_speculative_ptos = '\0';
  return;
}

Assistant:

static void test_even(void)
{
    quicly_loss_conf_t lossconf = QUICLY_LOSS_SPEC_CONF;
    struct loss_cond_t cond_down, cond_up;
    size_t num_sent, num_received;
    int ret;

    quic_ctx.loss = lossconf;
    init_cond_even(&cond_down);
    init_cond_even(&cond_up);

    quic_now = 1;

    { /* transmit first flight */
        quicly_address_t destaddr, srcaddr;
        struct iovec raw;
        uint8_t rawbuf[quic_ctx.transport_params.max_udp_payload_size];
        size_t num_packets;
        quicly_decoded_packet_t decoded;

        ret = quicly_connect(&client, &quic_ctx, "example.com", &fake_address.sa, NULL, new_master_id(), ptls_iovec_init(NULL, 0),
                             NULL, NULL);
        ok(ret == 0);
        num_packets = 1;
        ret = quicly_send(client, &destaddr, &srcaddr, &raw, &num_packets, rawbuf, sizeof(rawbuf));
        ok(ret == 0);
        ok(num_packets == 1);
        decode_packets(&decoded, &raw, 1);
        ok(num_packets == 1);
        ret = quicly_accept(&server, &quic_ctx, NULL, &fake_address.sa, &decoded, NULL, new_master_id(), NULL);
        ok(ret == 0);
        cond_up.cb(&cond_up);
    }

    /* server sends 2 datagrams (Initial+Handshake,Handshake+1RTT), the latter gets dropped */
    ret = transmit_cond(server, client, &num_sent, &num_received, &cond_down, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 2);
    ok(num_received == 1);
    ok(quicly_get_state(client) == QUICLY_STATE_CONNECTED);
    ok(!quicly_connection_is_ready(client));

    quic_now += QUICLY_DELAYED_ACK_TIMEOUT;

    /* client sends Handshake that gets dropped */
    ret = transmit_cond(client, server, &num_sent, &num_received, &cond_up, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 1);
    ok(num_received == 0);

    ok(quicly_get_state(client) == QUICLY_STATE_CONNECTED);
    ok(!quicly_connection_is_ready(client));

    quic_now += 1000;

    /* server resends 2 datagrams, the latter gets dropped again */
    ret = transmit_cond(server, client, &num_sent, &num_received, &cond_down, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 2);
    ok(num_received == 1);
    ok(quicly_get_state(client) == QUICLY_STATE_CONNECTED);
    ok(!quicly_connection_is_ready(client));

    quic_now += QUICLY_DELAYED_ACK_TIMEOUT;

    /* client sends Handshake again */
    ret = transmit_cond(client, server, &num_sent, &num_received, &cond_up, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 1);
    ok(num_received == 1);

    quic_now += 1000;

    /* server retransmits the unacked (Handshake+1RTT) packet */
    ret = transmit_cond(server, client, &num_sent, &num_received, &cond_down, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 1);
    ok(num_received == 1);

    ok(quicly_get_state(client) == QUICLY_STATE_CONNECTED);
    ok(quicly_connection_is_ready(client));

    /* client sends ClientFinished, gets lost */
    ret = transmit_cond(client, server, &num_sent, &num_received, &cond_up, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 1);
    ok(num_received == 0);

    quic_now += 1000;

    /* server retransmits the unacked packet */
    ret = transmit_cond(server, client, &num_sent, &num_received, &cond_down, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 1);
    ok(num_received == 0);

    quic_now += 1000;

    /* client resends ClientFinished */
    ret = transmit_cond(client, server, &num_sent, &num_received, &cond_up, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 1);
    ok(num_received == 1);

    ok(quicly_get_state(server) == QUICLY_STATE_CONNECTED);
    ok(quicly_connection_is_ready(server));

    quic_ctx.loss = (quicly_loss_conf_t)QUICLY_LOSS_SPEC_CONF;
}